

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O1

void __thiscall cfd::SignParameter::SignParameter(SignParameter *this,ScriptOperator *op_code)

{
  pointer puVar1;
  value_type_conflict1 *__val;
  vector<unsigned_char,_std::allocator<unsigned_char>_> list;
  ByteData local_58;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  
  cfd::core::ByteData::ByteData(&this->data_);
  this->data_type_ = kOpCode;
  cfd::core::Pubkey::Pubkey(&this->related_pubkey_);
  this->der_encode_ = false;
  cfd::core::SigHashType::SigHashType(&this->sighash_type_);
  cfd::core::ScriptOperator::ScriptOperator(&this->op_code_,op_code);
  local_38 = (undefined1 *)0x0;
  puStack_30 = (undefined1 *)0x0;
  local_28 = (undefined1 *)0x0;
  local_38 = (undefined1 *)operator_new(1);
  puStack_30 = local_38 + 1;
  *local_38 = 0;
  *local_38 = (char)(this->op_code_).data_type_;
  local_28 = puStack_30;
  cfd::core::ByteData::ByteData(&local_58,(vector *)&local_38);
  puVar1 = (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  if (local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38 != (undefined1 *)0x0) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

SignParameter::SignParameter(const ScriptOperator& op_code)
    : data_(),
      data_type_(SignDataType::kOpCode),
      related_pubkey_(),
      der_encode_(false),
      sighash_type_(),
      op_code_(op_code) {
  std::vector<uint8_t> list(1);
  list[0] = static_cast<uint8_t>(op_code_.GetDataType());
  data_ = ByteData(list);
}